

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor_tests.cpp
# Opt level: O1

void check_csv_cursor_table<jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>>
               (string *info,
               basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *cursor,
               string *expected_key,uint expected_value)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  string *psVar4;
  bool bVar5;
  Flags FVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage31;
  char local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ITransientExpression local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  char *local_208;
  size_type sStack_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  MessageBuilder local_1f0;
  StringRef local_190;
  uint local_17c;
  string *local_178;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  ScopedMessage local_80;
  
  local_220._vptr_ITransientExpression = (_func_int **)0x815958;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3e4;
  local_17c = expected_value;
  local_178 = expected_key;
  Catch::MessageBuilder::MessageBuilder
            (&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f0.super_MessageStream.m_stream.m_oss,(info->_M_dataplus)._M_p,
             info->_M_string_length);
  Catch::ScopedMessage::ScopedMessage(&local_80,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_info.message._M_dataplus._M_p != &local_1f0.m_info.message.field_2) {
    operator_delete(local_1f0.m_info.message._M_dataplus._M_p,
                    CONCAT53(local_1f0.m_info.message.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_1f0.m_info.message.field_2._M_local_buf[2],
                                      local_1f0.m_info.message.field_2._M_allocated_capacity._0_2_))
                    + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_1f0);
  local_220._vptr_ITransientExpression = (_func_int **)0x8156d8;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3e6;
  Catch::StringRef::StringRef(&local_120,"cursor.done()");
  FVar6 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_120,FVar6);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_220._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_220._vptr_ITransientExpression._1_7_,(char)iVar7);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_1f0,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 999;
  Catch::StringRef::StringRef
            (&local_90,"staj_event_type::begin_array == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_90,Normal);
  local_190.m_start._0_4_ = CONCAT31(local_190.m_start._1_3_,0xe);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var,iVar7);
  cVar2 = (char)local_190.m_start;
  local_241 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_240,"==");
  local_220.m_result = cVar2 == cVar1;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59a68;
  local_208 = local_240._M_dataplus._M_p;
  sStack_200 = local_240._M_string_length;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_241;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x81570c;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3e9;
  Catch::StringRef::StringRef(&local_130,"cursor.done()");
  FVar6 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_130,FVar6);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_220._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_220._vptr_ITransientExpression._1_7_,(char)iVar7);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_1f0,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_220._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3eb;
  Catch::StringRef::StringRef
            (&local_a0,"staj_event_type::begin_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_a0,Normal);
  local_190.m_start._0_4_ = CONCAT31(local_190.m_start._1_3_,0xd);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_00,iVar7);
  cVar2 = (char)local_190.m_start;
  local_241 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_240,"==");
  local_220.m_result = cVar2 == cVar1;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59a68;
  local_208 = local_240._M_dataplus._M_p;
  sStack_200 = local_240._M_string_length;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_241;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x81570c;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3ed;
  Catch::StringRef::StringRef(&local_140,"cursor.done()");
  FVar6 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_140,FVar6);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_220._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_220._vptr_ITransientExpression._1_7_,(char)iVar7);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_1f0,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_220._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3ef;
  Catch::StringRef::StringRef(&local_b0,"staj_event_type::key == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_b0,Normal);
  local_190.m_start._0_4_ = (uint)local_190.m_start & 0xffffff00;
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_01,iVar7);
  cVar2 = (char)local_190.m_start;
  local_241 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_240,"==");
  local_220.m_result = cVar2 == cVar1;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59a68;
  local_208 = local_240._M_dataplus._M_p;
  sStack_200 = local_240._M_string_length;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_241;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x8102c5;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3f0;
  Catch::StringRef::StringRef
            (&local_c0,"cursor.current().template get<std::string>() == expected_key");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_c0,ContinueOnFailure);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  jsoncons::basic_staj_event<char>::get<std::__cxx11::string>
            (&local_240,(basic_staj_event<char> *)CONCAT44(extraout_var_02,iVar7));
  psVar4 = local_178;
  bVar5 = Catch::compareEqual<std::__cxx11::string,std::__cxx11::string>(&local_240,local_178);
  Catch::StringRef::StringRef(&local_190,"==");
  local_208 = (char *)CONCAT44(local_190.m_start._4_4_,(uint)local_190.m_start);
  local_220.m_result = bVar5;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59fe0;
  sStack_200 = local_190.m_size;
  local_1f8 = psVar4;
  local_210 = &local_240;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x81570c;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3f2;
  Catch::StringRef::StringRef(&local_150,"cursor.done()");
  FVar6 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_150,FVar6);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_220._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_220._vptr_ITransientExpression._1_7_,(char)iVar7);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_1f0,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_220._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3f4;
  Catch::StringRef::StringRef
            (&local_d0,"staj_event_type::uint64_value == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_d0,Normal);
  local_190.m_start._0_4_ = CONCAT31(local_190.m_start._1_3_,6);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_03,iVar7);
  cVar2 = (char)local_190.m_start;
  local_241 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_240,"==");
  local_220.m_result = cVar2 == cVar1;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59a68;
  local_208 = local_240._M_dataplus._M_p;
  sStack_200 = local_240._M_string_length;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_241;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x8102c5;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3f5;
  Catch::StringRef::StringRef
            (&local_e0,"cursor.current().template get<unsigned>() == expected_value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_e0,ContinueOnFailure);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  uVar8 = jsoncons::basic_staj_event<char>::get<unsigned_int>
                    ((basic_staj_event<char> *)CONCAT44(extraout_var_04,iVar7));
  uVar3 = local_17c;
  local_190.m_start._0_4_ = uVar8;
  Catch::StringRef::StringRef((StringRef *)&local_240,"==");
  local_220.m_result = uVar8 == uVar3;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b5d830;
  local_208 = local_240._M_dataplus._M_p;
  sStack_200 = local_240._M_string_length;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_17c;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x81570c;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3f7;
  Catch::StringRef::StringRef(&local_160,"cursor.done()");
  FVar6 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_160,FVar6);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_220._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_220._vptr_ITransientExpression._1_7_,(char)iVar7);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_1f0,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_220._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3f9;
  Catch::StringRef::StringRef
            (&local_f0,"staj_event_type::end_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_f0,Normal);
  local_190.m_start._0_4_ = CONCAT31(local_190.m_start._1_3_,7);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_05,iVar7);
  cVar2 = (char)local_190.m_start;
  local_241 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_240,"==");
  local_220.m_result = cVar2 == cVar1;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59a68;
  local_208 = local_240._M_dataplus._M_p;
  sStack_200 = local_240._M_string_length;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_241;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_220._vptr_ITransientExpression = (_func_int **)0x81570c;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3fb;
  Catch::StringRef::StringRef(&local_170,"cursor.done()");
  FVar6 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_170,FVar6);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_220._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_220._vptr_ITransientExpression._1_7_,(char)iVar7);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_1f0,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_220._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x3fd;
  Catch::StringRef::StringRef
            (&local_100,"staj_event_type::end_array == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_100,Normal);
  local_190.m_start._0_4_ = CONCAT31(local_190.m_start._1_3_,0xf);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_06,iVar7);
  cVar2 = (char)local_190.m_start;
  local_241 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_240,"==");
  local_220.m_result = cVar2 == cVar1;
  local_220.m_isBinaryExpression = true;
  local_220._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59a68;
  local_208 = local_240._M_dataplus._M_p;
  sStack_200 = local_240._M_string_length;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_241;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_1f0,&local_220);
  Catch::ITransientExpression::~ITransientExpression(&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_220._vptr_ITransientExpression = (_func_int **)0x8102c5;
  local_220.m_isBinaryExpression = true;
  local_220.m_result = false;
  local_220._10_6_ = 0;
  local_240._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
  ;
  local_240._M_string_length = 0x400;
  Catch::StringRef::StringRef(&local_110,"cursor.done()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_1f0,(StringRef *)&local_220,(SourceLineInfo *)&local_240,
             local_110,ContinueOnFailure);
  iVar7 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_220._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_220._vptr_ITransientExpression._1_7_,(char)iVar7);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_1f0,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_1f0);
  if (local_1f0.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_1f0.m_info.message.field_2._8_8_ + 0x70))();
  }
  Catch::ScopedMessage::~ScopedMessage(&local_80);
  return;
}

Assistant:

void check_csv_cursor_table(std::string info, CursorType& cursor,
                            std::string expected_key, unsigned expected_value)
{
    INFO(info);

    REQUIRE_FALSE(cursor.done());
    REQUIRE(staj_event_type::begin_array == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::begin_object == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::key == cursor.current().event_type());
    CHECK(cursor.current().template get<std::string>() == expected_key);

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::uint64_value == cursor.current().event_type());
    CHECK(cursor.current().template get<unsigned>() == expected_value);

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::end_object == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::end_array == cursor.current().event_type());

    cursor.next();
    CHECK(cursor.done());
}